

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::init
          (ConcurrentAtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  const_reference pvVar6;
  TestLog *pTVar7;
  ShaderProgram *pSVar8;
  ProgramSources *pPVar9;
  TestError *pTVar10;
  allocator<char> local_381;
  string local_380;
  undefined1 local_359;
  string local_358;
  ShaderSource local_338;
  ProgramSources local_310;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  ScopedLogSection local_1f0;
  ScopedLogSection section_1;
  string local_1e0;
  undefined1 local_1b9;
  string local_1b8;
  ShaderSource local_198;
  ProgramSources local_170;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  ScopedLogSection local_50;
  ScopedLogSection section;
  allocator<unsigned_int> local_35;
  value_type_conflict2 local_34;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  Functions *gl;
  ConcurrentAtomicCounterCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
  iVar4 = this->m_numCalls;
  iVar1 = this->m_workSize;
  local_34 = 0;
  std::allocator<unsigned_int>::allocator(&local_35);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,(long)(iVar4 * iVar1),
             &local_34,&local_35);
  std::allocator<unsigned_int>::~allocator(&local_35);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1b2))(1,&this->m_counterBuffer);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x10))(0x90d2,this->m_counterBuffer);
  pcVar2 = *(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x54);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
  (*pcVar2)(0x90d2,4,pvVar6,0x88ea);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1b2))
            (1,&this->m_intermediateResultBuffer);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x10))
            (0x90d2,this->m_intermediateResultBuffer);
  pcVar2 = *(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x54);
  iVar4 = this->m_numCalls;
  iVar1 = this->m_workSize;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
  (*pcVar2)(0x90d2,(long)iVar4 * (long)iVar1 * 4,pvVar6,0x88ea);
  err = (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x97b);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"EvenProgram",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Even program",&local_99);
  tcu::ScopedLogSection::ScopedLogSection(&local_50,pTVar7,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  local_1b9 = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_170);
  (anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
            (&local_1b8,this,true);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_198,&local_1b8);
  pPVar9 = glu::ProgramSources::operator<<(&local_170,&local_198);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar5,pPVar9);
  local_1b9 = 0;
  this->m_evenProgram = pSVar8;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_170);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,this->m_evenProgram);
  bVar3 = glu::ShaderProgram::isOk(this->m_evenProgram);
  if (!bVar3) {
    section_1.m_log._6_1_ = 1;
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"could not build program",
               (allocator<char> *)((long)&section_1.m_log + 7));
    tcu::TestError::TestError(pTVar10,&local_1e0);
    section_1.m_log._6_1_ = 0;
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_50);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"OddProgram",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Odd program",&local_239);
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,pTVar7,&local_210,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  local_359 = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_310);
  (anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
            (&local_358,this,false);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_338,&local_358);
  pPVar9 = glu::ProgramSources::operator<<(&local_310,&local_338);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar5,pPVar9);
  local_359 = 0;
  this->m_oddProgram = pSVar8;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  glu::ProgramSources::~ProgramSources(&local_310);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,this->m_oddProgram);
  bVar3 = glu::ShaderProgram::isOk(this->m_oddProgram);
  if (!bVar3) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"could not build program",&local_381);
    tcu::TestError::TestError(pTVar10,&local_380);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return extraout_EAX;
}

Assistant:

void ConcurrentAtomicCounterCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const std::vector<deUint32>	zeroData	(m_numCalls * m_workSize, 0);

	// gen buffer

	gl.genBuffers(1, &m_counterBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_counterBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32), &zeroData[0], GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_intermediateResultBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_numCalls * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "EvenProgram", "Even program");

		m_evenProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(true)));
		m_testCtx.getLog() << *m_evenProgram;
		if (!m_evenProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "OddProgram", "Odd program");

		m_oddProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(false)));
		m_testCtx.getLog() << *m_oddProgram;
		if (!m_oddProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}